

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O2

void fft_execute(fft_plan p)

{
  long lVar1;
  long lVar2;
  int i;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (p.sign == 1) {
    uVar5 = 0;
    if (0 < p.n) {
      uVar5 = (ulong)(uint)p.n;
    }
    if (p.c_in == (fft_complex *)0x0) {
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        p.input[uVar3] = p.in[uVar3];
      }
      rdft(p.n,1,p.input,p.ip,p.w);
      (*p.c_out)[0] = *p.input;
      (*p.c_out)[1] = 0.0;
      lVar2 = (long)(p.n / 2);
      lVar4 = 0x18;
      for (lVar1 = 1; lVar1 < lVar2; lVar1 = lVar1 + 1) {
        *(undefined8 *)((long)p.c_out[-1] + lVar4 + 8) = *(undefined8 *)((long)p.input + lVar4 + -8)
        ;
        *(ulong *)((long)*p.c_out + lVar4) = *(ulong *)((long)p.input + lVar4) ^ 0x8000000000000000;
        lVar4 = lVar4 + 0x10;
      }
      p.c_out[lVar2][0] = p.input[1];
      p.c_out[lVar2][1] = 0.0;
    }
    else {
      for (lVar1 = 0; uVar5 * 0x10 != lVar1; lVar1 = lVar1 + 0x10) {
        *(undefined8 *)((long)p.input + lVar1) = *(undefined8 *)((long)*p.c_in + lVar1);
        *(undefined8 *)((long)p.input + lVar1 + 8) = *(undefined8 *)((long)*p.c_in + lVar1 + 8);
      }
      cdft(p.n * 2,1,p.input,p.ip,p.w);
      for (lVar1 = 0; uVar5 * 0x10 != lVar1; lVar1 = lVar1 + 0x10) {
        *(undefined8 *)((long)*p.c_out + lVar1) = *(undefined8 *)((long)p.input + lVar1);
        *(ulong *)((long)*p.c_out + lVar1 + 8) =
             *(ulong *)((long)p.input + lVar1 + 8) ^ 0x8000000000000000;
      }
    }
  }
  else if (p.c_out == (fft_complex *)0x0) {
    *p.input = (*p.c_in)[0];
    p.input[1] = p.c_in[p.n / 2][0];
    lVar4 = 0x18;
    for (lVar1 = 1; lVar1 < p.n / 2; lVar1 = lVar1 + 1) {
      *(undefined8 *)((long)p.input + lVar4 + -8) = *(undefined8 *)((long)p.c_in[-1] + lVar4 + 8);
      *(ulong *)((long)p.input + lVar4) = *(ulong *)((long)*p.c_in + lVar4) ^ 0x8000000000000000;
      lVar4 = lVar4 + 0x10;
    }
    rdft(p.n,-1,p.input,p.ip,p.w);
    uVar3 = 0;
    uVar5 = (ulong)(uint)p.n;
    if (p.n < 1) {
      uVar5 = uVar3;
    }
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      p.out[uVar3] = p.input[uVar3] + p.input[uVar3];
    }
  }
  else {
    lVar1 = 0;
    uVar5 = 0;
    if (0 < p.n) {
      uVar5 = (ulong)(uint)p.n;
    }
    for (; uVar5 * 0x10 != lVar1; lVar1 = lVar1 + 0x10) {
      *(undefined8 *)((long)p.input + lVar1) = *(undefined8 *)((long)*p.c_in + lVar1);
      *(undefined8 *)((long)p.input + lVar1 + 8) = *(undefined8 *)((long)*p.c_in + lVar1 + 8);
    }
    cdft(p.n * 2,-1,p.input,p.ip,p.w);
    for (lVar1 = 0; uVar5 * 0x10 != lVar1; lVar1 = lVar1 + 0x10) {
      *(undefined8 *)((long)*p.c_out + lVar1) = *(undefined8 *)((long)p.input + lVar1);
      *(ulong *)((long)*p.c_out + lVar1 + 8) =
           *(ulong *)((long)p.input + lVar1 + 8) ^ 0x8000000000000000;
    }
  }
  return;
}

Assistant:

void fft_execute(fft_plan p) {
  if (p.sign == FFT_FORWARD) {
    ForwardFFT(p);
  } else {  // ifft
    BackwardFFT(p);
  }
}